

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

ParseResult *
tinyusdz::prim::anon_unknown_0::ParseExtentAttribute
          (ParseResult *__return_storage_ptr__,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *table,string *prop_name,Property *prop,string *name,
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *target)

{
  PrimVar *this;
  pointer paVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  value_type *pvVar7;
  pointer pSVar8;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar9;
  value_type *value;
  pointer pSVar10;
  ResultCode RVar11;
  string *psVar12;
  pointer pPVar13;
  long lVar14;
  optional<tinyusdz::Animatable<tinyusdz::Extent>_> local_138;
  string *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_d0;
  optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_> local_c8;
  undefined1 local_a8 [16];
  optional<tinyusdz::Animatable<tinyusdz::Extent>_> av;
  string attr_type_name;
  
  (__return_storage_ptr__->err)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->err).field_2;
  (__return_storage_ptr__->err)._M_string_length = 0;
  (__return_storage_ptr__->err).field_2._M_local_buf[0] = '\0';
  iVar5 = ::std::__cxx11::string::compare((string *)prop_name);
  if (iVar5 != 0) goto LAB_001a3e6a;
  sVar6 = ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(table,name);
  if (sVar6 != 0) {
    __return_storage_ptr__->code = AlreadyProcessed;
    return __return_storage_ptr__;
  }
  psVar12 = &__return_storage_ptr__->err;
  Attribute::type_name_abi_cxx11_(&attr_type_name,&prop->_attrib);
  local_f0 = psVar12;
  if (prop->_type == Attrib) {
    local_e8 = (prop->_attrib)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start;
    pPVar13 = (prop->_attrib)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pPVar13 != local_e8) {
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&target->_paths,
                 &(prop->_attrib)._paths);
    }
    local_d0 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)table;
    bVar4 = Attribute::is_blocked(&prop->_attrib);
    if (bVar4) {
      target->_blocked = true;
    }
    this = &(prop->_attrib)._var;
    bVar4 = primvar::PrimVar::has_value(this);
    if ((bVar4) ||
       (*(pointer *)
         ((long)&(prop->_attrib)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data + 8) !=
        (prop->_attrib)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      av.has_value_ = false;
      av._1_7_ = 0x7f8000007f8000;
      av.contained.data.__align = (anon_struct_8_0_00000001_for___align)0xff8000007f800000;
      av.contained._8_8_ = 0xff800000ff800000;
      av.contained._16_2_ = 0;
      av.contained._24_8_ = 0;
      av.contained._32_1_ = 0;
      av.contained._33_7_ = 0;
      av.contained._40_1_ = 0;
      av.contained._41_8_ = 0;
      bVar4 = primvar::PrimVar::is_valid(this);
      if (bVar4) {
        bVar4 = primvar::PrimVar::has_value(this);
        if (bVar4) {
          primvar::PrimVar::
          get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                    ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                      *)&local_138,this);
          local_c8.has_value_ = local_138.has_value_;
          if (local_138.has_value_ == true) {
            local_c8.contained._4_4_ = local_138.contained._4_4_;
            local_c8.contained._0_4_ = local_138.contained._0_4_;
            local_c8.contained._8_8_ =
                 CONCAT44(local_138.contained._12_4_,local_138.contained._8_4_);
            local_c8.contained._16_8_ = local_138.contained._16_8_;
            local_138.contained._0_4_ = 0.0;
            local_138.contained._4_4_ = 0;
            local_138.contained._8_4_ = 0;
            local_138.contained._12_4_ = 0.0;
            local_138.contained._16_8_ = 0;
            nonstd::optional_lite::
            optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
            ::~optional((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                         *)&local_138);
            pvVar7 = nonstd::optional_lite::
                     optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                     ::value(&local_c8);
            if ((long)(pvVar7->
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar7->
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start != 0x18) {
              local_138._0_8_ = local_138._0_8_ & 0xffffffffffffff00;
              local_138.contained._0_4_ = 0.0;
              local_138.contained._4_4_ = 0;
              local_138.contained._8_4_ = 0;
              local_138.contained._12_4_ = 0.0;
              local_138.contained._16_8_ = 0;
              local_138.contained._24_8_ = 0;
              local_138.contained._32_8_ = 0;
              local_138.contained._40_8_ = 0;
              local_138.contained._48_8_ = 0;
              local_138.contained._56_8_ = 0;
              nonstd::optional_lite::
              optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
              ::~optional(&local_c8);
              goto LAB_001a42c1;
            }
            pvVar7 = nonstd::optional_lite::
                     optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                     ::value(&local_c8);
            paVar1 = (pvVar7->
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_e8 = *(pointer *)(paVar1->_M_elems + 1);
            uStack_e0 = 0;
            local_a8 = ZEXT416((uint)paVar1->_M_elems[0]);
            pvVar7 = nonstd::optional_lite::
                     optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                     ::value(&local_c8);
            paVar1 = (pvVar7->
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            av._4_4_ = (undefined4)local_e8;
            av._0_4_ = local_a8._0_4_;
            av.contained._4_4_ = paVar1[1]._M_elems[0];
            av.contained._0_4_ = local_e8._4_4_;
            av.contained._8_8_ = *(undefined8 *)(paVar1[1]._M_elems + 1);
            av.contained._16_2_ = 1;
          }
          else {
            nonstd::optional_lite::
            optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
            ::~optional((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                         *)&local_138);
          }
          nonstd::optional_lite::
          optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
          ~optional(&local_c8);
          pSVar10 = (prop->_attrib)._var._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar8 = *(pointer *)
                    ((long)&(prop->_attrib)._var._ts._samples.
                            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                            ._M_impl.super__Vector_impl_data + 8);
          if (pSVar8 != pSVar10) goto LAB_001a4114;
        }
        else {
          pSVar10 = (prop->_attrib)._var._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar8 = *(pointer *)
                    ((long)&(prop->_attrib)._var._ts._samples.
                            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                            ._M_impl.super__Vector_impl_data + 8);
          if (pSVar8 == pSVar10) goto LAB_001a40b8;
LAB_001a4114:
          local_a8._0_8_ = &(prop->_attrib)._var._ts;
          lVar14 = 0;
          pPVar13 = (pointer)0x0;
          while (pPVar13 < (pointer)(((long)pSVar8 - (long)pSVar10) / 0x28)) {
            local_e8 = pPVar13;
            pvVar9 = tinyusdz::value::TimeSamples::get_samples((TimeSamples *)local_a8._0_8_);
            pSVar10 = (pvVar9->
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if ((&pSVar10->blocked)[lVar14] == true) {
              TypedTimeSamples<tinyusdz::Extent>::add_blocked_sample
                        ((TypedTimeSamples<tinyusdz::Extent> *)((long)&av.contained + 0x18),
                         *(double *)((long)&pSVar10->t + lVar14));
            }
            else {
              tinyusdz::value::Value::
              get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                        ((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                          *)&local_138,(Value *)((long)&(pSVar10->value).v_.storage + lVar14),false)
              ;
              local_c8.has_value_ = local_138.has_value_;
              if (local_138.has_value_ == true) {
                local_c8.contained._4_4_ = local_138.contained._4_4_;
                local_c8.contained._0_4_ = local_138.contained._0_4_;
                local_c8.contained._8_8_ =
                     CONCAT44(local_138.contained._12_4_,local_138.contained._8_4_);
                local_c8.contained._16_8_ = local_138.contained._16_8_;
                local_138.contained._0_4_ = 0.0;
                local_138.contained._4_4_ = 0;
                local_138.contained._8_4_ = 0;
                local_138.contained._12_4_ = 0.0;
                local_138.contained._16_8_ = 0;
              }
              nonstd::optional_lite::
              optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
              ::~optional((optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                           *)&local_138);
              if ((local_c8.has_value_ != true) ||
                 (pvVar7 = nonstd::optional_lite::
                           optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                           ::value(&local_c8),
                 (long)(pvVar7->
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar7->
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start != 0x18)) {
                local_138._0_8_ = local_138._0_8_ & 0xffffffffffffff00;
                local_138.contained._0_4_ = 0.0;
                local_138.contained._4_4_ = 0;
                local_138.contained._8_4_ = 0;
                local_138.contained._12_4_ = 0.0;
                local_138.contained._16_8_ = 0;
                local_138.contained._24_8_ = 0;
                local_138.contained._32_8_ = 0;
                local_138.contained._40_8_ = 0;
                local_138.contained._48_8_ = 0;
                local_138.contained._56_8_ = 0;
                nonstd::optional_lite::
                optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                ::~optional(&local_c8);
                psVar12 = local_f0;
                goto LAB_001a42c1;
              }
              local_138.has_value_ = false;
              local_138._1_7_ = 0x7f8000007f8000;
              local_138.contained._0_4_ = 0x7f800000;
              local_138.contained._4_4_ = 0xff800000;
              local_138.contained._8_4_ = 0xff800000;
              local_138.contained._12_4_ = 0xff800000;
              pvVar7 = nonstd::optional_lite::
                       optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                       ::value(&local_c8);
              paVar1 = (pvVar7->
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_138._0_8_ = *(undefined8 *)paVar1->_M_elems;
              local_138.contained._0_4_ = paVar1->_M_elems[2];
              pvVar7 = nonstd::optional_lite::
                       optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                       ::value(&local_c8);
              paVar1 = (pvVar7->
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar2 = *(undefined8 *)paVar1[1]._M_elems;
              local_138.contained._4_4_ = (undefined4)uVar2;
              local_138.contained._8_4_ = (undefined4)((ulong)uVar2 >> 0x20);
              local_138.contained._12_4_ = paVar1[1]._M_elems[2];
              TypedTimeSamples<tinyusdz::Extent>::add_sample
                        ((TypedTimeSamples<tinyusdz::Extent> *)((long)&av.contained + 0x18),
                         *(double *)((long)&pSVar10->t + lVar14),(Extent *)&local_138);
              nonstd::optional_lite::
              optional<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
              ::~optional(&local_c8);
            }
            pSVar10 = (prop->_attrib)._var._ts._samples.
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pSVar8 = *(pointer *)
                      ((long)&(prop->_attrib)._var._ts._samples.
                              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                              ._M_impl.super__Vector_impl_data + 8);
            lVar14 = lVar14 + 0x28;
            pPVar13 = (pointer)((long)&(local_e8->_prim_part)._M_dataplus._M_p + 1);
          }
        }
        nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::
        optional<tinyusdz::Animatable<tinyusdz::Extent>,_0>
                  (&local_138,(Animatable<tinyusdz::Extent> *)&av);
        psVar12 = local_f0;
      }
      else {
LAB_001a40b8:
        local_138._0_8_ = local_138._0_8_ & 0xffffffffffffff00;
        local_138.contained._0_4_ = 0.0;
        local_138.contained._4_4_ = 0;
        local_138.contained._8_4_ = 0;
        local_138.contained._12_4_ = 0.0;
        local_138.contained._16_8_ = 0;
        local_138.contained._24_8_ = 0;
        local_138.contained._32_8_ = 0;
        local_138.contained._40_8_ = 0;
        local_138.contained._48_8_ = 0;
        local_138.contained._56_8_ = 0;
      }
LAB_001a42c1:
      ::std::
      _Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
      ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                       *)((long)&av.contained + 0x18));
      nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::
      optional<tinyusdz::Animatable<tinyusdz::Extent>,_0>(&av,&local_138);
      nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::~optional
                (&local_138);
      bVar4 = av.has_value_;
      if (av.has_value_ == true) {
        value = nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::value(&av)
        ;
        nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>>::operator=
                  ((optional<tinyusdz::Animatable<tinyusdz::Extent>> *)&target->_attrib,value);
      }
      else {
        __return_storage_ptr__->code = InternalError;
        ::std::__cxx11::string::assign((char *)psVar12);
      }
      nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Extent>_>::~optional(&av);
      bVar3 = false;
      if (bVar4 != false) goto LAB_001a4344;
      bVar4 = true;
    }
    else {
      if (pPVar13 != local_e8) {
LAB_001a4344:
        RVar11 = Success;
        AttrMetas::operator=(&target->_metas,&(prop->_attrib)._metas);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_d0,name);
        goto LAB_001a4365;
      }
      bVar3 = true;
      bVar4 = false;
    }
  }
  else {
    if (prop->_type == EmptyAttrib) {
      target->_value_empty = true;
      AttrMetas::operator=(&target->_metas,&(prop->_attrib)._metas);
      ::std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)table,name);
      RVar11 = Success;
    }
    else {
      ::std::__cxx11::string::assign((char *)psVar12);
      RVar11 = InternalError;
    }
LAB_001a4365:
    __return_storage_ptr__->code = RVar11;
    bVar4 = true;
    bVar3 = false;
  }
  ::std::__cxx11::string::_M_dispose();
  if (!bVar3) {
    if (bVar4) {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::_M_dispose();
    return __return_storage_ptr__;
  }
LAB_001a3e6a:
  __return_storage_ptr__->code = Unmatched;
  return __return_storage_ptr__;
}

Assistant:

static ParseResult ParseExtentAttribute(std::set<std::string> &table, /* inout */
  const std::string prop_name,
  const Property &prop,
  const std::string &name,
  TypedAttribute<Animatable<Extent>> &target) /* out */
{
  ParseResult ret;

#if 0
  if (prop_name.compare(name + ".connect") == 0) {
    std::string propname = removeSuffix(name, ".connect");
    if (table.count(propname)) {
      DCOUT("Already processed: " << prop_name);
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }
    if (prop.is_connection()) {
      const Attribute &attr = prop.get_attribute();
      if (attr.is_connection()) {
        target.set_connections(attr.connections());
        //target.variability = prop.attrib.variability;
        target.metas() = prop.get_attribute().metas();
        table.insert(propname);
        ret.code = ParseResult::ResultCode::Success;
        DCOUT("Added as property with connection: " << propname);
        return ret;
      } else {
        ret.code = ParseResult::ResultCode::InvalidConnection;
        ret.err = "Connection target not found.";
        return ret;
      }
    } else {
      ret.code = ParseResult::ResultCode::InternalError;
      ret.err = "Internal error. Unsupported/Unimplemented property type.";
      return ret;
    }
#endif
  if (prop_name.compare(name) == 0) {
    if (table.count(name)) {
      ret.code = ParseResult::ResultCode::AlreadyProcessed;
      return ret;
    }

    const Attribute &attr = prop.get_attribute();

    std::string attr_type_name = attr.type_name();
    if (prop.get_property_type() == Property::Type::EmptyAttrib) {
      DCOUT("Added prop with empty value: " << name);
      target.set_value_empty();
      target.metas() = attr.metas();
      table.insert(name);
      ret.code = ParseResult::ResultCode::Success;
      return ret;
    } else if (prop.get_property_type() == Property::Type::Attrib) {

      //bool has_default{false};
      bool has_connections{false};

      if (attr.has_connections()) {
        target.set_connections(attr.connections());
        //target.variability = prop.attrib.variability;
        //target.metas() = prop.get_attribute().metas();
        //table.insert(prop_name);
        //ret.code = ParseResult::ResultCode::Success;
        //return ret;
        has_connections = true;
      }

      DCOUT("Adding typed extent attribute: " << name);

      if (attr.is_blocked()) {
        // e.g. "float3[] extent = None"
        target.set_blocked(true);
      }

#if 0
      } else {
        
        //
        // No variability check. allow `uniform extent`(promote to varying)
        //
        if (auto pv = attr.get_value<std::vector<value::float3>>()) {
          if (pv.value().size() != 2) {
            ret.code = ParseResult::ResultCode::TypeMismatch;
            ret.err = fmt::format("`extent` must be `float3[2]`, but got array size {}", pv.value().size());
            return ret;
          }

          Extent ext;
          ext.lower = pv.value()[0];
          ext.upper = pv.value()[1];

          //target.set_value(ext);
          animatable_value.set(ext);
        } else {
          ret.code = ParseResult::ResultCode::TypeMismatch;
          ret.err = fmt::format("`extent` must be `float3[]` type, but got `{}`", attr.type_name());
          return ret;
        }
      }

      if (attr.get_var().has_timesamples()) {
        // e.g. "float3[] extent.timeSamples = ..."

        if (auto av = ConvertToAnimatable<Extent>(attr.get_var())) {
          animatable_value.set(av.value().get_timesamples());
          //target.set_value(anim);
          
          has_timesamples = true;
        } else {
          // Conversion failed.
          DCOUT("ConvertToAnimatable failed.");
          ret.code = ParseResult::ResultCode::InternalError;
          ret.err = "Converting Attribute data failed. Maybe TimeSamples have values with different types or invalid array size?";
          return ret;
        }
      }

      if (has_default || has_timesamples) {
        DCOUT("Added Extent attribute: " << name);
        target.metas() = attr.metas();
        table.insert(name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      } else {
        DCOUT("Internal error.");
        ret.code = ParseResult::ResultCode::InternalError;
        ret.err = "Internal error. Invalid Attribute data";
        return ret;
      }
#else
      
      const auto &var = attr.get_var();

      if (var.has_default() || var.has_timesamples()) {
        if (auto av = ConvertToAnimatable<Extent>(var)) {
          target.set_value(av.value());
        } else {
          DCOUT("ConvertToAnimatable failed.");
          ret.code = ParseResult::ResultCode::InternalError;
          ret.err = "Converting Attribute data failed. Maybe TimeSamples have values with different types?";
          return ret;
        }

        DCOUT("Added typed extent attribute: " << name);

        target.metas() = attr.metas();
        table.insert(name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      }

      if (has_connections) {
        DCOUT("Added Extent connection attribute: " << name);
        target.metas() = attr.metas();
        table.insert(name);
        ret.code = ParseResult::ResultCode::Success;
        return ret;
      }

#endif

    } else {
      DCOUT("Invalid Property.type");
      ret.err = "Invalid Property type(internal error)";
      ret.code = ParseResult::ResultCode::InternalError;
      return ret;
    }

  }

  ret.code = ParseResult::ResultCode::Unmatched;
  return ret;
}